

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall
QtPrivate::QCalendarModel::setHorizontalHeaderFormat
          (QCalendarModel *this,HorizontalHeaderFormat format)

{
  HorizontalHeaderFormat HVar1;
  long in_FS_OFFSET;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  HVar1 = this->m_horizontalHeaderFormat;
  if (HVar1 != format) {
    this->m_horizontalHeaderFormat = format;
    if (HVar1 == NoHorizontalHeader) {
      local_28 = 0xffffffffffffffff;
      local_20 = 0;
      uStack_18 = 0;
      QAbstractItemModel::beginInsertRows((QModelIndex *)this,(int)&local_28,0);
      this->m_firstRow = 1;
      QAbstractItemModel::endInsertRows();
    }
    else if (format == NoHorizontalHeader) {
      local_28 = 0xffffffffffffffff;
      local_20 = 0;
      uStack_18 = 0;
      QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_28,0);
      this->m_firstRow = 0;
      QAbstractItemModel::endRemoveRows();
    }
    internalUpdate(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::setHorizontalHeaderFormat(QCalendarWidget::HorizontalHeaderFormat format)
{
    if (m_horizontalHeaderFormat == format)
        return;

    int oldFormat = m_horizontalHeaderFormat;
    m_horizontalHeaderFormat = format;
    if (oldFormat == QCalendarWidget::NoHorizontalHeader) {
        beginInsertRows(QModelIndex(), 0, 0);
        m_firstRow = 1;
        endInsertRows();
    } else if (m_horizontalHeaderFormat == QCalendarWidget::NoHorizontalHeader) {
        beginRemoveRows(QModelIndex(), 0, 0);
        m_firstRow = 0;
        endRemoveRows();
    }
    internalUpdate();
}